

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O3

void verify_heap_entries(VMEMcache *cache,stat_t entries)

{
  long *__s1;
  long *plVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  size_t sVar5;
  undefined8 *puVar6;
  long *plVar7;
  undefined8 extraout_RDX;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  size_t __n;
  long lStack_68;
  undefined8 uStack_60;
  long local_10;
  stat_t stat;
  
  puVar6 = (undefined8 *)0x8;
  uVar9 = 8;
  iVar2 = vmemcache_get_stat(cache,8,&local_10);
  if (iVar2 == -1) {
    verify_heap_entries_cold_2();
  }
  else if (local_10 == 1) {
    return;
  }
  verify_heap_entries_cold_1();
  lVar4 = puVar6[3];
  puVar6[3] = lVar4 + 1U;
  if ((ulong)puVar6[5] < lVar4 + 1U) {
    return;
  }
  puVar6[4] = puVar6[4] + 1;
  plVar7 = (long *)*puVar6;
  iVar2 = vmemcache_put();
  if (iVar2 == 0) {
    return;
  }
  piVar3 = __errno_location();
  if (*piVar3 == 0x1c) {
    return;
  }
  uVar10 = uVar9;
  on_evict_test_put_in_evict_cb_cold_1();
  plVar7[3] = plVar7[3] + 1;
  uStack_60 = uVar9;
  lVar4 = vmemcache_get();
  if (lVar4 < 0) {
    on_evict_test_data_integrity_cold_8();
LAB_00106c5b:
    on_evict_test_data_integrity_cold_1();
LAB_00106c63:
    on_evict_test_data_integrity_cold_2();
LAB_00106c6f:
    on_evict_test_data_integrity_cold_3();
LAB_00106c77:
    on_evict_test_data_integrity_cold_7();
LAB_00106c7c:
    on_evict_test_data_integrity_cold_4();
  }
  else {
    plVar1 = (long *)plVar7[1];
    uVar8 = plVar1[1];
    if (lVar4 != uVar8 + 0x10) goto LAB_00106c5b;
    if (lStack_68 != lVar4) goto LAB_00106c63;
    __s1 = plVar1 + 2;
    iVar2 = bcmp(__s1,(void *)(*plVar7 + *plVar1),uVar8);
    if (iVar2 != 0) goto LAB_00106c6f;
    if (uVar8 < 0x101) {
      __n = uVar8 - 1;
    }
    else {
      iVar2 = rand();
      __n = (ulong)(long)iVar2 % (plVar1[1] - 0x100U) + 0x100;
    }
    iVar2 = rand();
    uVar8 = (ulong)(long)iVar2 % (plVar1[1] - __n);
    sVar5 = vmemcache_get(uVar10,piVar3,extraout_RDX,__s1,__n,uVar8 + 0x11,&lStack_68);
    if ((long)sVar5 < 0) goto LAB_00106c77;
    if (sVar5 != __n) goto LAB_00106c7c;
    if (lStack_68 == lVar4) {
      iVar2 = bcmp(__s1,(void *)(*plVar7 + *plVar1 + uVar8 + 1),__n);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00106c93;
    }
  }
  on_evict_test_data_integrity_cold_5();
LAB_00106c93:
  on_evict_test_data_integrity_cold_6();
  halt_baddata();
}

Assistant:

static void
verify_heap_entries(VMEMcache *cache, stat_t entries)
{
#ifdef STATS_ENABLED
	stat_t stat;
	int ret;

	ret = vmemcache_get_stat(cache, VMEMCACHE_STAT_HEAP_ENTRIES,
			&stat, sizeof(stat));
	if (ret == -1)
		UT_FATAL("vmemcache_get_stat: %s", vmemcache_errormsg());
	if (stat != entries)
		UT_FATAL(
			"vmemcache_get_stat: wrong statistic's (%s) value: %llu (should be %llu)",
			stat_str[VMEMCACHE_STAT_HEAP_ENTRIES], stat, entries);
#endif
}